

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  PolicyStatus PVar7;
  long *plVar8;
  string *psVar9;
  ostream *poVar10;
  size_type *psVar11;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  PolicyID id_03;
  PolicyID id_04;
  PolicyID id_05;
  PolicyID id_06;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string emulated;
  string emulatedId;
  string compilerIdVar;
  string compilerId;
  ostringstream w;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  long *local_208 [2];
  long local_1f8 [2];
  undefined1 local_1e8 [112];
  ios_base local_178 [264];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                 "CMAKE_",lang);
  plVar8 = (long *)std::__cxx11::string::append((char *)local_1e8);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_228.field_2._M_allocated_capacity = *psVar11;
    local_228.field_2._8_8_ = plVar8[3];
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar11;
    local_228._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_228._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pcVar2 = local_1e8 + 0x10;
  if ((pointer)local_1e8._0_8_ != pcVar2) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  psVar9 = cmMakefile::GetSafeDefinition(mf,&local_228);
  local_208[0] = local_1f8;
  pcVar4 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,pcVar4,pcVar4 + psVar9->_M_string_length);
  iVar6 = std::__cxx11::string::compare((char *)local_208);
  if (iVar6 == 0) {
    PVar7 = cmMakefile::GetPolicyStatus(mf,CMP0025,false);
    if (PVar7 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x19,id_00);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1e8);
      if ((pointer)local_1e8._0_8_ != pcVar2) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
    }
    else {
      if (PVar7 != OLD) {
        if (PVar7 != WARN) goto LAB_0025f8b7;
        bVar5 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (bVar5) {
          bVar5 = false;
        }
        else {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"CMAKE_POLICY_WARNING_CMP0025","");
          bVar5 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar5 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_288,(cmPolicies *)0x19,id_03);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,local_288._M_dataplus._M_p,
                               local_288._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nConverting ",0xc);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," compiler id \"AppleClang\" to \"Clang\" for compatibility.",0x37);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
        }
      }
      value._M_str = "Clang";
      value._M_len = 5;
      cmMakefile::AddDefinition(mf,&local_228,value);
    }
  }
LAB_0025f8b7:
  iVar6 = std::__cxx11::string::compare((char *)local_208);
  if (iVar6 == 0) {
    PVar7 = cmMakefile::GetPolicyStatus(mf,CMP0047,false);
    if (PVar7 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x2f,id_01);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1e8);
    }
    else {
      if (PVar7 != OLD) {
        if (PVar7 != WARN) goto LAB_0025f8d3;
        bVar5 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (bVar5) {
          bVar5 = false;
        }
        else {
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_288,"CMAKE_POLICY_WARNING_CMP0047","");
          bVar5 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar5 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2a8,(cmPolicies *)0x2f,id_04);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,local_2a8._M_dataplus._M_p,
                               local_2a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nConverting ",0xc);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," compiler id \"QCC\" to \"GNU\" for compatibility.",0x2e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
        }
      }
      value_00._M_str = "GNU";
      value_00._M_len = 3;
      cmMakefile::AddDefinition(mf,&local_228,value_00);
      iVar6 = std::__cxx11::string::compare((char *)lang);
      if (iVar6 == 0) {
        local_1e8._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUCC","");
        value_02._M_str = "1";
        value_02._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_1e8,value_02);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)lang);
        if (iVar6 != 0) goto LAB_0025f8d3;
        local_1e8._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUCXX","");
        value_01._M_str = "1";
        value_01._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_1e8,value_01);
      }
    }
    if ((pointer)local_1e8._0_8_ != pcVar2) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
  }
LAB_0025f8d3:
  iVar6 = std::__cxx11::string::compare((char *)local_208);
  if (iVar6 == 0) {
    PVar7 = cmMakefile::GetPolicyStatus(mf,CMP0089,false);
    if (PVar7 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x59,id_02);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1e8);
      if ((pointer)local_1e8._0_8_ != pcVar2) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
    }
    else {
      if (PVar7 != OLD) {
        if (PVar7 != WARN) goto LAB_0025f8ef;
        bVar5 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (bVar5) {
          bVar5 = false;
        }
        else {
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,"CMAKE_POLICY_WARNING_CMP0089","");
          bVar5 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar5 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_268,(cmPolicies *)0x59,id_05);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,local_268._M_dataplus._M_p,
                               local_268._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nConverting ",0xc);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," compiler id \"XLClang\" to \"XL\" for compatibility.",0x31);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
        }
      }
      value_03._M_str = "XL";
      value_03._M_len = 2;
      cmMakefile::AddDefinition(mf,&local_228,value_03);
    }
  }
LAB_0025f8ef:
  iVar6 = std::__cxx11::string::compare((char *)local_208);
  if (iVar6 != 0) goto LAB_002604a0;
  PVar7 = cmMakefile::GetPolicyStatus(mf,CMP0129,false);
  if (PVar7 - REQUIRED_IF_USED < 2) {
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1e8,(cmPolicies *)0x81,id);
    cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1e8);
  }
  else {
    if (PVar7 != OLD) {
      if (PVar7 != WARN) goto LAB_002604a0;
      bVar5 = cmake::GetIsInTryCompile(this->CMakeInstance);
      if (bVar5) {
        bVar5 = false;
      }
      else {
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"CMAKE_POLICY_WARNING_CMP0129","");
        bVar5 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar5 != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2c8,(cmPolicies *)0x81,id_06);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,local_2c8._M_dataplus._M_p,
                             local_2c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nConverting ",0xc);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(lang->_M_dataplus)._M_p,lang->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," compiler id \"LCC\" to \"GNU\" for compatibility.",0x2e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
      }
    }
    value_04._M_str = "GNU";
    value_04._M_len = 3;
    cmMakefile::AddDefinition(mf,&local_228,value_04);
    iVar6 = std::__cxx11::string::compare((char *)lang);
    if (iVar6 == 0) {
      local_1e8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUCC","");
      value_06._M_str = "1";
      value_06._M_len = 1;
      cmMakefile::AddDefinition(mf,(string *)local_1e8,value_06);
LAB_00260243:
      if ((pointer)local_1e8._0_8_ != pcVar2) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)lang);
      if (iVar6 == 0) {
        local_1e8._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUCXX","");
        value_07._M_str = "1";
        value_07._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_1e8,value_07);
        goto LAB_00260243;
      }
      iVar6 = std::__cxx11::string::compare((char *)lang);
      if (iVar6 == 0) {
        local_1e8._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_COMPILER_IS_GNUG77","");
        value_05._M_str = "1";
        value_05._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_1e8,value_05);
        goto LAB_00260243;
      }
    }
    std::operator+(&local_2c8,"CMAKE_",lang);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar11) {
      local_1e8._16_8_ = *psVar11;
      local_1e8._24_8_ = plVar8[3];
      local_1e8._0_8_ = pcVar2;
    }
    else {
      local_1e8._16_8_ = *psVar11;
      local_1e8._0_8_ = (size_type *)*plVar8;
    }
    local_1e8._8_8_ = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    paVar1 = &local_2c8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_248,"CMAKE_",lang);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_248);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_2c8.field_2._M_allocated_capacity = *psVar11;
      local_2c8.field_2._8_8_ = plVar8[3];
      local_2c8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *psVar11;
      local_2c8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_2c8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    paVar3 = &local_248.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar3) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_50,"CMAKE_",lang);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_248.field_2._M_allocated_capacity = *psVar11;
      local_248.field_2._8_8_ = plVar8[3];
      local_248._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar11;
      local_248._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_248._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    psVar9 = cmMakefile::GetRequiredDefinition(mf,&local_2c8);
    value_08._M_str = (psVar9->_M_dataplus)._M_p;
    value_08._M_len = psVar9->_M_string_length;
    cmMakefile::AddDefinition(mf,(string *)local_1e8,value_08);
    cmMakefile::RemoveDefinition(mf,&local_248);
    cmMakefile::RemoveDefinition(mf,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar3) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pointer)local_1e8._0_8_ != pcVar2) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
LAB_002604a0:
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(
  cmMakefile* mf, std::string const& lang) const
{
  std::string compilerIdVar = "CMAKE_" + lang + "_COMPILER_ID";
  std::string const compilerId = mf->GetSafeDefinition(compilerIdVar);

  if (compilerId == "AppleClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0025)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            R"( compiler id "AppleClang" to "Clang" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "QCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0047)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            R"( compiler id "QCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
    }
  }

  if (compilerId == "XLClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0089)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0089")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0089) << "\n"
            "Converting " << lang <<
            R"( compiler id "XLClang" to "XL" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert XLClang to XL.
        mf->AddDefinition(compilerIdVar, "XL");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0089));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "LCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0129)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0129")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0129) << "\n"
            "Converting " << lang <<
            R"( compiler id "LCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert LCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        } else if (lang == "Fortran") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUG77", "1");
        }
        {
          // Fix compiler versions.
          std::string version = "CMAKE_" + lang + "_COMPILER_VERSION";
          std::string emulated = "CMAKE_" + lang + "_SIMULATE_VERSION";
          std::string emulatedId = "CMAKE_" + lang + "_SIMULATE_ID";
          std::string const& actual = mf->GetRequiredDefinition(emulated);
          mf->AddDefinition(version, actual);
          mf->RemoveDefinition(emulatedId);
          mf->RemoveDefinition(emulated);
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0129));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep LCC.
        break;
    }
  }
}